

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O0

void hadamard_highbd_col8_first_pass(int16_t *src_diff,ptrdiff_t src_stride,int16_t *coeff)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  int16_t c7;
  int16_t c6;
  int16_t c5;
  int16_t c4;
  int16_t c3;
  int16_t c2;
  int16_t c1;
  int16_t c0;
  int16_t b7;
  int16_t b6;
  int16_t b5;
  int16_t b4;
  int16_t b3;
  int16_t b2;
  int16_t b1;
  int16_t b0;
  int16_t *coeff_local;
  ptrdiff_t src_stride_local;
  int16_t *src_diff_local;
  
  sVar1 = *src_diff + src_diff[src_stride] + src_diff[src_stride * 2] + src_diff[src_stride * 3];
  sVar2 = (*src_diff - src_diff[src_stride]) + (src_diff[src_stride * 2] - src_diff[src_stride * 3])
  ;
  sVar3 = (*src_diff + src_diff[src_stride]) - (src_diff[src_stride * 2] + src_diff[src_stride * 3])
  ;
  sVar4 = (*src_diff - src_diff[src_stride]) - (src_diff[src_stride * 2] - src_diff[src_stride * 3])
  ;
  sVar5 = src_diff[src_stride * 4] + src_diff[src_stride * 5] +
          src_diff[src_stride * 6] + src_diff[src_stride * 7];
  sVar6 = (src_diff[src_stride * 4] - src_diff[src_stride * 5]) +
          (src_diff[src_stride * 6] - src_diff[src_stride * 7]);
  sVar7 = (src_diff[src_stride * 4] + src_diff[src_stride * 5]) -
          (src_diff[src_stride * 6] + src_diff[src_stride * 7]);
  sVar8 = (src_diff[src_stride * 4] - src_diff[src_stride * 5]) -
          (src_diff[src_stride * 6] - src_diff[src_stride * 7]);
  *coeff = sVar1 + sVar5;
  coeff[7] = sVar2 + sVar6;
  coeff[3] = sVar3 + sVar7;
  coeff[4] = sVar4 + sVar8;
  coeff[2] = sVar1 - sVar5;
  coeff[6] = sVar2 - sVar6;
  coeff[1] = sVar3 - sVar7;
  coeff[5] = sVar4 - sVar8;
  return;
}

Assistant:

static void hadamard_highbd_col8_first_pass(const int16_t *src_diff,
                                            ptrdiff_t src_stride,
                                            int16_t *coeff) {
  int16_t b0 = src_diff[0 * src_stride] + src_diff[1 * src_stride];
  int16_t b1 = src_diff[0 * src_stride] - src_diff[1 * src_stride];
  int16_t b2 = src_diff[2 * src_stride] + src_diff[3 * src_stride];
  int16_t b3 = src_diff[2 * src_stride] - src_diff[3 * src_stride];
  int16_t b4 = src_diff[4 * src_stride] + src_diff[5 * src_stride];
  int16_t b5 = src_diff[4 * src_stride] - src_diff[5 * src_stride];
  int16_t b6 = src_diff[6 * src_stride] + src_diff[7 * src_stride];
  int16_t b7 = src_diff[6 * src_stride] - src_diff[7 * src_stride];

  int16_t c0 = b0 + b2;
  int16_t c1 = b1 + b3;
  int16_t c2 = b0 - b2;
  int16_t c3 = b1 - b3;
  int16_t c4 = b4 + b6;
  int16_t c5 = b5 + b7;
  int16_t c6 = b4 - b6;
  int16_t c7 = b5 - b7;

  coeff[0] = c0 + c4;
  coeff[7] = c1 + c5;
  coeff[3] = c2 + c6;
  coeff[4] = c3 + c7;
  coeff[2] = c0 - c4;
  coeff[6] = c1 - c5;
  coeff[1] = c2 - c6;
  coeff[5] = c3 - c7;
}